

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O1

Pointer __thiscall
dg::pta::LLVMPointerGraphBuilder::handleConstantBitCast(LLVMPointerGraphBuilder *this,CastInst *BC)

{
  Type TVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  char cVar4;
  DataLayout *this_00;
  ulong uVar5;
  long lVar6;
  undefined8 *puVar7;
  Value *val;
  PSNode *pPVar8;
  byte bVar9;
  code *pcVar10;
  long lVar11;
  TypeSize TVar12;
  Pointer PVar13;
  TypeSize local_30;
  
  cVar4 = llvm::CastInst::isLosslessCast();
  if (cVar4 == '\0') {
    this_00 = (DataLayout *)llvm::Module::getDataLayout();
    TVar1 = (*(Type **)BC)[8];
    if (TVar1 != (Type)0xf) {
      if (TVar1 == (Type)0xd) {
        TVar12 = llvm::DataLayout::getTypeSizeInBits(this_00,*(Type **)BC);
        local_30.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>
        .Value = TVar12.super_LinearPolySize<llvm::TypeSize>.
                 super_UnivariateLinearPolyBase<llvm::TypeSize>.Value;
        local_30.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>
        .UnivariateDim =
             TVar12.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim;
        uVar5 = llvm::TypeSize::operator_cast_to_unsigned_long(&local_30);
        lVar6 = llvm::DataLayout::getPointerAlignElem((uint)this_00);
        if (*(uint *)(lVar6 + 4) <= uVar5) goto LAB_0011e5b7;
      }
      puVar7 = &UnknownPointer;
      pcVar10 = dg::pta::PointerGraphValidator::warn;
      goto LAB_0011e624;
    }
  }
LAB_0011e5b7:
  val = (Value *)llvm::Value::stripPointerCasts();
  pPVar8 = getOperand(this,val);
  p_Var2 = (pPVar8->pointsTo).pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h._M_before_begin._M_nxt;
  if (((pPVar8->pointsTo).pointers._bits.
       super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
       .
       super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ._M_h._M_element_count == 0) || (p_Var3 = p_Var2[2]._M_nxt, ((ulong)p_Var3 & 1) != 0)) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    do {
      if (lVar6 == 0x3f) {
        lVar6 = 0x40;
        break;
      }
      bVar9 = (byte)lVar6;
      lVar6 = lVar6 + 1;
    } while (((ulong)p_Var3 >> (bVar9 & 0x3f) & 2) == 0);
  }
  lVar6 = lVar6 * 0x10 + _setEntry;
  lVar11 = (long)p_Var2[1]._M_nxt * 0x10;
  puVar7 = (undefined8 *)(lVar11 + lVar6 + -0x10);
  pcVar10 = (code *)(lVar6 + lVar11 + -8);
LAB_0011e624:
  PVar13.offset.offset = *(type *)pcVar10;
  PVar13.target = (PSNode *)*puVar7;
  return PVar13;
}

Assistant:

Pointer
LLVMPointerGraphBuilder::handleConstantBitCast(const llvm::CastInst *BC) {
    using namespace llvm;

    if (!BC->isLosslessCast()) {
        // If this is a cast to a bigger type (if that can ever happen?),
        // then preserve the pointer. Otherwise, the pointer is cropped,
        // and there's nothing we can do...
        if (!llvmutils::typeCanBePointer(&M->getDataLayout(), BC->getType()))
            return UnknownPointer;
        // fall-through
    }

    const Value *llvmOp = BC->stripPointerCasts();
    // (possibly recursively) get the operand of this bit-cast
    PSNode *op = getOperand(llvmOp);
    assert(op->pointsTo.size() == 1 &&
           "Constant BitCast with not only one pointer");

    return *op->pointsTo.begin();
}